

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeUnary(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,UnaryOp op)

{
  Unary *pUVar1;
  bool bVar2;
  Ok local_a5;
  uint local_a4;
  Err local_a0;
  Err *local_70;
  Err *err;
  Result<wasm::Ok> _val;
  Unary curr;
  UnaryOp op_local;
  IRBuilder *this_local;
  
  pUVar1 = (Unary *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  Unary::Unary(pUVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitUnary
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pUVar1);
  local_70 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_70 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_a0,local_70);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
    wasm::Err::~Err(&local_a0);
  }
  local_a4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_a4 == 0) {
    pUVar1 = Builder::makeUnary(&this->builder,op,(Expression *)curr._16_8_);
    push(this,(Expression *)pUVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_a5);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeUnary(UnaryOp op) {
  Unary curr;
  curr.op = op;
  CHECK_ERR(visitUnary(&curr));
  push(builder.makeUnary(op, curr.value));
  return Ok{};
}